

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

void __thiscall cmCTestCoverageHandler::LoadLabels(cmCTestCoverageHandler *this,char *dir)

{
  cmCTest *this_00;
  bool bVar1;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_01;
  ostream *poVar2;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *p_Var3;
  bool bVar4;
  int id;
  LabelMapType *local_440;
  string line;
  vector<int,_std::allocator<int>_> targetLabels;
  string fname;
  string label;
  string source;
  ifstream fin;
  byte abStack_218 [488];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&fin,dir,(allocator<char> *)&source);
  this_01 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>_>
            ::operator[](&this->TargetDirs,(key_type *)&fin);
  std::__cxx11::string::~string((string *)&fin);
  std::__cxx11::string::string<std::allocator<char>>((string *)&fname,dir,(allocator<char> *)&fin);
  std::__cxx11::string::append((char *)&fname);
  std::ifstream::ifstream(&fin,fname._M_dataplus._M_p,_S_in);
  if ((abStack_218[*(long *)(_fin + -0x18)] & 5) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
    poVar2 = std::operator<<((ostream *)&source," loading labels from [");
    poVar2 = std::operator<<(poVar2,(string *)&fname);
    std::operator<<(poVar2,"]\n");
    this_00 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_00,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x8cc,line._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
    source._M_dataplus._M_p = (pointer)&source.field_2;
    source._M_string_length = 0;
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    source.field_2._M_local_buf[0] = '\0';
    line.field_2._M_local_buf[0] = '\0';
    targetLabels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    targetLabels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    targetLabels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_440 = &this->SourceLabels;
    bVar4 = true;
    while( true ) {
      bVar1 = cmsys::SystemTools::GetLineFromStream((istream *)&fin,&line,(bool *)0x0,-1);
      if (!bVar1) break;
      if (line._M_string_length != 0) {
        if (*line._M_dataplus._M_p != '#') {
          if (*line._M_dataplus._M_p == ' ') {
            std::__cxx11::string::substr((ulong)&label,(ulong)&line);
            id = GetLabelId(this,&label);
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>(this_01,&id);
            if (bVar4) {
              std::vector<int,_std::allocator<int>_>::push_back(&targetLabels,&id);
            }
            else {
              p_Var3 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>_>
                       ::operator[](local_440,&source);
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>(p_Var3,&id);
            }
            std::__cxx11::string::~string((string *)&label);
          }
          else {
            cmCTest::GetShortPathToFile_abi_cxx11_
                      (&label,(this->super_cmCTestGenericHandler).CTest,line._M_dataplus._M_p);
            std::__cxx11::string::operator=((string *)&source,(string *)&label);
            std::__cxx11::string::~string((string *)&label);
            p_Var3 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>_>
                     ::operator[](local_440,&source);
            bVar4 = false;
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_range_unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                      (p_Var3,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                              targetLabels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       targetLabels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
          }
        }
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&targetLabels.super__Vector_base<int,_std::allocator<int>_>);
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::string::~string((string *)&source);
  }
  std::ifstream::~ifstream(&fin);
  std::__cxx11::string::~string((string *)&fname);
  return;
}

Assistant:

void cmCTestCoverageHandler::LoadLabels(const char* dir)
{
  LabelSet& dirLabels = this->TargetDirs[dir];
  std::string fname = dir;
  fname += "/Labels.txt";
  cmsys::ifstream fin(fname.c_str());
  if (!fin) {
    return;
  }

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " loading labels from [" << fname << "]\n", this->Quiet);
  bool inTarget = true;
  std::string source;
  std::string line;
  std::vector<int> targetLabels;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (line.empty() || line[0] == '#') {
      // Ignore blank and comment lines.
      continue;
    }
    if (line[0] == ' ') {
      // Label lines appear indented by one space.
      std::string label = line.substr(1);
      int id = this->GetLabelId(label);
      dirLabels.insert(id);
      if (inTarget) {
        targetLabels.push_back(id);
      } else {
        this->SourceLabels[source].insert(id);
      }
    } else {
      // Non-indented lines specify a source file name.  The first one
      // is the end of the target-wide labels.
      inTarget = false;

      source = this->CTest->GetShortPathToFile(line.c_str());

      // Label the source with the target labels.
      LabelSet& labelSet = this->SourceLabels[source];
      labelSet.insert(targetLabels.begin(), targetLabels.end());
    }
  }
}